

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O0

uint8_t * chunkmemset_safe_sse2(uint8_t *out,uint8_t *from,uint len,uint left)

{
  uint in_ECX;
  uint in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint local_24;
  uint local_1c;
  uint8_t *local_18;
  uint8_t *local_10;
  uint8_t *local_8;
  
  local_24 = in_EDX;
  if (in_ECX < in_EDX) {
    local_24 = in_ECX;
  }
  local_1c = local_24;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_ECX < 0x10) {
    for (; local_1c != 0; local_1c = local_1c - 1) {
      *local_10 = *local_18;
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    }
    local_8 = local_10;
  }
  else {
    if (local_24 != 0) {
      local_10 = chunkmemset_sse2(out,from,len);
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

Z_INTERNAL uint8_t* CHUNKMEMSET_SAFE(uint8_t *out, uint8_t *from, unsigned len, unsigned left) {
#if OPTIMAL_CMP < 32
    static const uint32_t align_mask = 7;
#elif OPTIMAL_CMP == 32
    static const uint32_t align_mask = 3;
#endif

    len = MIN(len, left);

#if OPTIMAL_CMP < 64
    while (((uintptr_t)out & align_mask) && (len > 0)) {
        *out++ = *from++;
        --len;
        --left;
    }
#endif

#ifndef HAVE_MASKED_READWRITE
    if (UNLIKELY(left < sizeof(chunk_t))) {
        while (len > 0) {
            *out++ = *from++;
            --len;
        }

        return out;
    }
#endif

    if (len)
        out = CHUNKMEMSET(out, from, len);

    return out;
}